

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O2

void * dexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ExpHeader *pEVar3;
  char *src;
  int iVar4;
  int_t *piVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  MemType MVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  float local_44;
  
  pEVar3 = Glu->expanders;
  iVar4 = *prev_len;
  iVar14 = (int)((float)iVar4 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar14 = iVar4;
  }
  if (keep_prev != 0) {
    iVar14 = iVar4;
  }
  MVar9 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    bVar6 = MVar9 == LSUB ^ 3;
    pvVar12 = superlu_malloc((long)iVar14 << bVar6);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        local_44 = 1.5;
        iVar4 = 10;
        while (pvVar12 == (void *)0x0) {
          bVar15 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar15) {
            return (void *)0x0;
          }
          local_44 = (local_44 + 1.0) * 0.5;
          iVar14 = (int)((float)*prev_len * local_44);
          pvVar12 = superlu_malloc((long)iVar14 << bVar6);
        }
      }
      else if (pvVar12 == (void *)0x0) {
        return (void *)0x0;
      }
      if (MVar9 == LSUB) {
        copy_mem_int(len_to_copy,pEVar3[type].mem,pvVar12);
      }
      else {
        copy_mem_double(len_to_copy,pEVar3[type].mem,pvVar12);
      }
      superlu_free(pEVar3[type].mem);
    }
    pEVar3[type].mem = pvVar12;
  }
  else if (Glu->num_expansions == 0) {
    pvVar12 = duser_malloc(iVar14 << (MVar9 == LSUB ^ 3U),0,Glu);
    if ((type < LSUB) && (iVar4 = (int)pvVar12, ((ulong)pvVar12 & 7) != 0)) {
      uVar8 = (long)pvVar12 + 7;
      pvVar12 = (void *)(uVar8 & 0xfffffffffffffff8);
      iVar4 = ((uint)uVar8 & 0xfffffff8) - iVar4;
      uVar1 = (Glu->stack).used;
      uVar2 = (Glu->stack).top1;
      (Glu->stack).used = iVar4 + uVar1;
      (Glu->stack).top1 = iVar4 + uVar2;
    }
    pEVar3[type].mem = pvVar12;
  }
  else {
    bVar6 = MVar9 == LSUB ^ 3;
    iVar13 = iVar14 - iVar4 << bVar6;
    iVar7 = (Glu->stack).used;
    if (keep_prev == 0) {
      fVar16 = 1.5;
      iVar10 = 10;
      while ((Glu->stack).size <= iVar7 + iVar13) {
        bVar15 = iVar10 == 0;
        iVar10 = iVar10 + -1;
        if (bVar15) {
          return (void *)0x0;
        }
        fVar16 = (fVar16 + 1.0) * 0.5;
        iVar14 = (int)(fVar16 * (float)iVar4);
        iVar13 = iVar14 - iVar4 << bVar6;
      }
    }
    else if ((Glu->stack).size <= iVar7 + iVar13) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar3[type + UCOL].mem;
      lVar11 = (long)iVar13;
      user_bcopy(src,src + lVar11,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar5 = (int_t *)((long)pEVar3[3].mem + lVar11);
        pEVar3[3].mem = piVar5;
        Glu->usub = piVar5;
        if (type != LSUB) {
          piVar5 = (int_t *)((long)pEVar3[2].mem + lVar11);
          pEVar3[2].mem = piVar5;
          Glu->lsub = piVar5;
          if (type == LUSUP) {
            pvVar12 = (void *)(lVar11 + (long)pEVar3[1].mem);
            pEVar3[1].mem = pvVar12;
            Glu->ucol = pvVar12;
          }
        }
      }
      iVar4 = (Glu->stack).top1 + iVar13;
      (Glu->stack).top1 = iVar4;
      iVar7 = (Glu->stack).used + iVar13;
      (Glu->stack).used = iVar7;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar4 + iVar13;
        (Glu->stack).used = iVar7 + iVar13;
      }
    }
  }
  pEVar3[type].size = iVar14;
  *prev_len = iVar14;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar3[type].mem;
}

Assistant:

void
*dexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(double);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_double(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = duser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}